

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall btMultiBodyDynamicsWorld::calculateSimulationIslands(btMultiBodyDynamicsWorld *this)

{
  btPersistentManifold *this_00;
  btTypedConstraint *this_01;
  btMultiBodyConstraint *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  btSimulationIslandManager *pbVar5;
  btCollisionWorld *pbVar6;
  btCollisionWorld *this_02;
  btDispatcher *pbVar7;
  btPersistentManifold **ppbVar8;
  btCollisionObject *pbVar9;
  btCollisionObject *this_03;
  btTypedConstraint **ppbVar10;
  btRigidBody *this_04;
  btRigidBody *this_05;
  btMultiBody **ppbVar11;
  btMultibodyLink *pbVar12;
  btMultiBodyConstraint **ppbVar13;
  btUnionFind *pbVar14;
  btDiscreteDynamicsWorld *in_RDI;
  int tagB;
  int tagA;
  btMultiBodyConstraint *c;
  int i_3;
  int tagCur;
  int tagPrev;
  btMultiBodyLinkCollider *cur;
  int b;
  btMultiBodyLinkCollider *prev;
  btMultiBody *body;
  int i_2;
  btRigidBody *colObj1_1;
  btRigidBody *colObj0_1;
  btTypedConstraint *constraint;
  int numConstraints;
  int i_1;
  btCollisionObject *colObj1;
  btCollisionObject *colObj0;
  btPersistentManifold *manifold;
  int i;
  CProfileSample __profile;
  char *in_stack_fffffffffffffe28;
  btMultiBody *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  btUnionFind *in_stack_fffffffffffffe40;
  int local_8c;
  int local_74;
  btCollisionObject *local_70;
  int local_5c;
  int local_3c;
  int local_20;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  pbVar5 = btDiscreteDynamicsWorld::getSimulationIslandManager(in_RDI);
  pbVar6 = btDiscreteDynamicsWorld::getCollisionWorld(in_RDI);
  this_02 = btDiscreteDynamicsWorld::getCollisionWorld(in_RDI);
  pbVar7 = btCollisionWorld::getDispatcher(this_02);
  (*pbVar5->_vptr_btSimulationIslandManager[2])(pbVar5,pbVar6,pbVar7);
  for (local_20 = 0;
      iVar3 = btAlignedObjectArray<btPersistentManifold_*>::size(&in_RDI->m_predictiveManifolds),
      local_20 < iVar3; local_20 = local_20 + 1) {
    ppbVar8 = btAlignedObjectArray<btPersistentManifold_*>::operator[]
                        (&in_RDI->m_predictiveManifolds,local_20);
    this_00 = *ppbVar8;
    pbVar9 = btPersistentManifold::getBody0(this_00);
    this_03 = btPersistentManifold::getBody1(this_00);
    if ((((pbVar9 != (btCollisionObject *)0x0) &&
         (bVar2 = btCollisionObject::isStaticOrKinematicObject(pbVar9), !bVar2)) &&
        (this_03 != (btCollisionObject *)0x0)) &&
       (bVar2 = btCollisionObject::isStaticOrKinematicObject(this_03), !bVar2)) {
      pbVar5 = btDiscreteDynamicsWorld::getSimulationIslandManager(in_RDI);
      btSimulationIslandManager::getUnionFind(pbVar5);
      btCollisionObject::getIslandTag(pbVar9);
      btCollisionObject::getIslandTag(this_03);
      btUnionFind::unite(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                         (int)in_stack_fffffffffffffe38);
    }
  }
  iVar3 = btAlignedObjectArray<btTypedConstraint_*>::size(&in_RDI->m_constraints);
  for (local_3c = 0; local_3c < iVar3; local_3c = local_3c + 1) {
    ppbVar10 = btAlignedObjectArray<btTypedConstraint_*>::operator[]
                         (&in_RDI->m_constraints,local_3c);
    this_01 = *ppbVar10;
    bVar2 = btTypedConstraint::isEnabled(this_01);
    if (bVar2) {
      this_04 = btTypedConstraint::getRigidBodyA(this_01);
      this_05 = btTypedConstraint::getRigidBodyB(this_01);
      if ((((this_04 != (btRigidBody *)0x0) &&
           (bVar2 = btCollisionObject::isStaticOrKinematicObject(&this_04->super_btCollisionObject),
           !bVar2)) && (this_05 != (btRigidBody *)0x0)) &&
         (bVar2 = btCollisionObject::isStaticOrKinematicObject(&this_05->super_btCollisionObject),
         !bVar2)) {
        pbVar5 = btDiscreteDynamicsWorld::getSimulationIslandManager(in_RDI);
        btSimulationIslandManager::getUnionFind(pbVar5);
        btCollisionObject::getIslandTag(&this_04->super_btCollisionObject);
        btCollisionObject::getIslandTag(&this_05->super_btCollisionObject);
        btUnionFind::unite(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                           ,(int)in_stack_fffffffffffffe38);
      }
    }
  }
  for (local_5c = 0;
      iVar3 = btAlignedObjectArray<btMultiBody_*>::size
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 1)), local_5c < iVar3;
      local_5c = local_5c + 1) {
    ppbVar11 = btAlignedObjectArray<btMultiBody_*>::operator[]
                         ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 1),local_5c);
    local_70 = (btCollisionObject *)btMultiBody::getBaseCollider(*ppbVar11);
    for (local_74 = 0; iVar3 = btMultiBody::getNumLinks((btMultiBody *)0x24d12a), local_74 < iVar3;
        local_74 = local_74 + 1) {
      pbVar12 = btMultiBody::getLink
                          (in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20)
                          );
      pbVar9 = (btCollisionObject *)pbVar12->m_collider;
      if (((pbVar9 != (btCollisionObject *)0x0) &&
          (bVar2 = btCollisionObject::isStaticOrKinematicObject(pbVar9), !bVar2)) &&
         ((local_70 != (btCollisionObject *)0x0 &&
          (bVar2 = btCollisionObject::isStaticOrKinematicObject(local_70), !bVar2)))) {
        btCollisionObject::getIslandTag(local_70);
        btCollisionObject::getIslandTag(pbVar9);
        pbVar5 = btDiscreteDynamicsWorld::getSimulationIslandManager(in_RDI);
        btSimulationIslandManager::getUnionFind(pbVar5);
        btUnionFind::unite(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                           ,(int)in_stack_fffffffffffffe38);
      }
      if ((pbVar9 != (btCollisionObject *)0x0) &&
         (bVar2 = btCollisionObject::isStaticOrKinematicObject(pbVar9), !bVar2)) {
        local_70 = pbVar9;
      }
    }
  }
  for (local_8c = 0;
      iVar3 = btAlignedObjectArray<btMultiBodyConstraint_*>::size
                        ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
                         &in_RDI[1].super_btDynamicsWorld.super_btCollisionWorld.m_collisionObjects.
                          m_ownsMemory), local_8c < iVar3; local_8c = local_8c + 1) {
    ppbVar13 = btAlignedObjectArray<btMultiBodyConstraint_*>::operator[]
                         ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
                          &in_RDI[1].super_btDynamicsWorld.super_btCollisionWorld.m_collisionObjects
                           .m_ownsMemory,local_8c);
    pbVar1 = *ppbVar13;
    iVar3 = (*pbVar1->_vptr_btMultiBodyConstraint[3])();
    iVar4 = (*pbVar1->_vptr_btMultiBodyConstraint[4])();
    if ((-1 < iVar3) && (-1 < iVar4)) {
      pbVar5 = btDiscreteDynamicsWorld::getSimulationIslandManager(in_RDI);
      pbVar14 = btSimulationIslandManager::getUnionFind(pbVar5);
      btUnionFind::unite((btUnionFind *)pbVar5,(int)((ulong)pbVar14 >> 0x20),(int)pbVar14);
    }
  }
  pbVar5 = btDiscreteDynamicsWorld::getSimulationIslandManager(in_RDI);
  pbVar6 = btDiscreteDynamicsWorld::getCollisionWorld(in_RDI);
  (*pbVar5->_vptr_btSimulationIslandManager[3])(pbVar5,pbVar6);
  CProfileSample::~CProfileSample((CProfileSample *)0x24d41b);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::calculateSimulationIslands()
{
	BT_PROFILE("calculateSimulationIslands");

	getSimulationIslandManager()->updateActivationState(getCollisionWorld(),getCollisionWorld()->getDispatcher());

    {
        //merge islands based on speculative contact manifolds too
        for (int i=0;i<this->m_predictiveManifolds.size();i++)
        {
            btPersistentManifold* manifold = m_predictiveManifolds[i];
            
            const btCollisionObject* colObj0 = manifold->getBody0();
            const btCollisionObject* colObj1 = manifold->getBody1();
            
            if (((colObj0) && (!(colObj0)->isStaticOrKinematicObject())) &&
                ((colObj1) && (!(colObj1)->isStaticOrKinematicObject())))
            {
				getSimulationIslandManager()->getUnionFind().unite((colObj0)->getIslandTag(),(colObj1)->getIslandTag());
            }
        }
    }
    
	{
		int i;
		int numConstraints = int(m_constraints.size());
		for (i=0;i< numConstraints ; i++ )
		{
			btTypedConstraint* constraint = m_constraints[i];
			if (constraint->isEnabled())
			{
				const btRigidBody* colObj0 = &constraint->getRigidBodyA();
				const btRigidBody* colObj1 = &constraint->getRigidBodyB();

				if (((colObj0) && (!(colObj0)->isStaticOrKinematicObject())) &&
					((colObj1) && (!(colObj1)->isStaticOrKinematicObject())))
				{
					getSimulationIslandManager()->getUnionFind().unite((colObj0)->getIslandTag(),(colObj1)->getIslandTag());
				}
			}
		}
	}

	//merge islands linked by Featherstone link colliders
	for (int i=0;i<m_multiBodies.size();i++)
	{
		btMultiBody* body = m_multiBodies[i];
		{
			btMultiBodyLinkCollider* prev = body->getBaseCollider();

			for (int b=0;b<body->getNumLinks();b++)
			{
				btMultiBodyLinkCollider* cur = body->getLink(b).m_collider;
				
				if (((cur) && (!(cur)->isStaticOrKinematicObject())) &&
					((prev) && (!(prev)->isStaticOrKinematicObject())))
				{
					int tagPrev = prev->getIslandTag();
					int tagCur = cur->getIslandTag();
					getSimulationIslandManager()->getUnionFind().unite(tagPrev, tagCur);
				}
				if (cur && !cur->isStaticOrKinematicObject())
					prev = cur;
				
			}
		}
	}

	//merge islands linked by multibody constraints
	{
		for (int i=0;i<this->m_multiBodyConstraints.size();i++)
		{
			btMultiBodyConstraint* c = m_multiBodyConstraints[i];
			int tagA = c->getIslandIdA();
			int tagB = c->getIslandIdB();
			if (tagA>=0 && tagB>=0)
				getSimulationIslandManager()->getUnionFind().unite(tagA, tagB);
		}
	}

	//Store the island id in each body
	getSimulationIslandManager()->storeIslandActivationState(getCollisionWorld());

}